

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O0

void __thiscall adios2::transport::FilePOSIX::SetParameters(FilePOSIX *this,Params *params)

{
  bool *in_stack_00000008;
  string *in_stack_00000010;
  Params *in_stack_00000018;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"FailOnEOF",&local_31);
  helper::GetParameter<bool>(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void FilePOSIX::SetParameters(const Params &params)
{
    // Parameters are set from config parameters if present
    // Otherwise, they are set from environment if present
    // Otherwise, they remain at their default value

    helper::GetParameter(params, "FailOnEOF", m_FailOnEOF);
}